

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<short,_true,_short>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<short,_true,_short> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  undefined2 uVar2;
  pointer pCVar3;
  short sVar4;
  short sVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    sVar4 = (state->state).maximum;
    sVar5 = *(short *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    if (sVar4 <= sVar5) {
      sVar5 = sVar4;
    }
    *(short *)((long)&(pCVar3->stats).statistics.stats_union + 8) = sVar5;
    sVar5 = *(short *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (sVar4 < sVar5) {
      sVar4 = sVar5;
    }
    *(short *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = sVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar2 = (state->state).minimum;
    sVar4 = *(short *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    if ((short)uVar2 <= sVar4) {
      sVar4 = uVar2;
    }
    *(short *)((long)&(pCVar3->stats).statistics.stats_union + 8) = sVar4;
    sVar4 = *(short *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    sVar5 = uVar2;
    if ((short)uVar2 < sVar4) {
      sVar5 = sVar4;
    }
    *(short *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = sVar5;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}